

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

void __thiscall jbcoin::STAmount::canonicalize(STAmount *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if ((this->mIssue).currency.pn[0] == 0) {
    uVar3 = 0;
    do {
      uVar2 = uVar3;
      if (uVar2 == 4) goto LAB_001ae8a9;
      uVar3 = uVar2 + 1;
    } while ((this->mIssue).currency.pn[uVar2 + 1] == 0);
    if (3 < uVar2) {
LAB_001ae8a9:
      this->mIsNative = true;
      uVar3 = this->mValue;
      if (uVar3 != 0) {
        iVar4 = this->mOffset;
        if (iVar4 < 0) {
          do {
            uVar3 = uVar3 / 10;
            iVar4 = iVar4 + 1;
          } while (iVar4 != 0);
        }
        else {
          if (iVar4 == 0) goto LAB_001ae9a7;
          uVar1 = iVar4 + 1;
          do {
            uVar3 = uVar3 * 10;
            uVar1 = uVar1 - 1;
          } while (1 < uVar1);
        }
        this->mValue = uVar3;
        this->mOffset = 0;
LAB_001ae9a7:
        if (uVar3 < 0x16345785d8a0001) {
          return;
        }
        Throw<std::runtime_error,char_const(&)[36]>
                  ((char (*) [36])"Native currency amount out of range");
      }
      this->mOffset = 0;
      goto LAB_001ae97e;
    }
  }
  this->mIsNative = false;
  uVar3 = this->mValue;
  if (uVar3 != 0) {
    iVar4 = this->mOffset;
    uVar2 = uVar3;
    if (uVar3 < 1000000000000000) {
      do {
        uVar2 = uVar3;
        if (iVar4 < -0x5f) break;
        uVar2 = uVar3 * 10;
        this->mValue = uVar2;
        iVar4 = iVar4 + -1;
        this->mOffset = iVar4;
        bVar6 = uVar3 < 100000000000000;
        uVar3 = uVar2;
      } while (bVar6);
    }
    uVar3 = uVar2;
    if (9999999999999999 < uVar2) {
      iVar5 = 0x50;
      if (0x50 < iVar4) {
        iVar5 = iVar4;
      }
      do {
        if (iVar5 == iVar4) goto LAB_001ae96b;
        uVar3 = uVar2 / 10;
        this->mValue = uVar3;
        iVar4 = iVar4 + 1;
        this->mOffset = iVar4;
        bVar6 = 99999999999999999 < uVar2;
        uVar2 = uVar3;
      } while (bVar6);
    }
    if (uVar3 < 1000000000000000 || iVar4 < -0x60) {
      this->mValue = 0;
      this->mIsNegative = false;
      this->mOffset = -100;
      return;
    }
    if (iVar4 < 0x51) {
      return;
    }
LAB_001ae96b:
    Throw<std::runtime_error,char_const(&)[15]>((char (*) [15])0x277da5);
  }
  this->mOffset = -100;
LAB_001ae97e:
  this->mIsNegative = false;
  return;
}

Assistant:

void STAmount::canonicalize ()
{
    if (isXRP (*this))
    {
        // native currency amounts should always have an offset of zero
        mIsNative = true;

        if (mValue == 0)
        {
            mOffset = 0;
            mIsNegative = false;
            return;
        }

        while (mOffset < 0)
        {
            mValue /= 10;
            ++mOffset;
        }

        while (mOffset > 0)
        {
            mValue *= 10;
            --mOffset;
        }

        if (mValue > cMaxNativeN)
            Throw<std::runtime_error> ("Native currency amount out of range");

        return;
    }

    mIsNative = false;

    if (mValue == 0)
    {
        mOffset = -100;
        mIsNegative = false;
        return;
    }

    while ((mValue < cMinValue) && (mOffset > cMinOffset))
    {
        mValue *= 10;
        --mOffset;
    }

    while (mValue > cMaxValue)
    {
        if (mOffset >= cMaxOffset)
            Throw<std::runtime_error> ("value overflow");

        mValue /= 10;
        ++mOffset;
    }

    if ((mOffset < cMinOffset) || (mValue < cMinValue))
    {
        mValue = 0;
        mIsNegative = false;
        mOffset = -100;
        return;
    }

    if (mOffset > cMaxOffset)
        Throw<std::runtime_error> ("value overflow");

    assert ((mValue == 0) || ((mValue >= cMinValue) && (mValue <= cMaxValue)));
    assert ((mValue == 0) || ((mOffset >= cMinOffset) && (mOffset <= cMaxOffset)));
    assert ((mValue != 0) || (mOffset != -100));
}